

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int tinyexr::DecodeChunk
              (EXRImage *exr_image,EXRHeader *exr_header,
              vector<unsigned_long,_std::allocator<unsigned_long>_> *offsets,uchar *head,size_t size
              ,string *err)

{
  int iVar1;
  int iVar2;
  int height;
  int line_order;
  int iVar3;
  pointer puVar4;
  pointer puVar5;
  EXRChannelInfo *pEVar6;
  long lVar7;
  EXRAttribute *attributes;
  int *piVar8;
  int width;
  int num_lines;
  long *plVar9;
  EXRTile *pEVar10;
  uchar **ppuVar11;
  ostream *poVar12;
  unsigned_long uVar13;
  int iVar14;
  int num_channels;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  uchar *puVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  size_t y_idx;
  ulong uVar23;
  int *piVar24;
  size_t __size;
  long lVar25;
  int iVar26;
  bool bVar27;
  bool bVar28;
  undefined4 in_stack_fffffffffffffd8c;
  int iVar29;
  EXRImage *pEVar30;
  char *local_240;
  size_type local_238;
  char local_230 [16];
  uchar *local_220;
  size_t local_218;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_210;
  int local_204;
  ulong local_200;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  stringstream ss;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar1 = exr_header->compression_type;
  iVar29 = 0x10;
  if ((iVar1 != 3) && (iVar1 != 0x80)) {
    if (iVar1 == 4) {
      iVar29 = 0x20;
    }
    else {
      iVar29 = 1;
    }
  }
  iVar1 = (exr_header->data_window).max_x;
  iVar2 = (exr_header->data_window).min_x;
  iVar22 = iVar1 - iVar2;
  if ((iVar1 < iVar2) ||
     (iVar1 = (exr_header->data_window).max_y, iVar2 = (exr_header->data_window).min_y,
     iVar14 = iVar1 - iVar2, iVar1 < iVar2)) {
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (err,"Invalid data window.\n");
    return -4;
  }
  iVar2 = iVar22 + 1;
  iVar1 = iVar14 + 1;
  if (0x7fffff < iVar22 || 0x7fffff < iVar14) {
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"data_with or data_height too large. data_width: ",0x30);
    poVar12 = (ostream *)std::ostream::operator<<(local_1a8,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"data_height = ",0xe);
    plVar9 = (long *)std::ostream::operator<<(poVar12,iVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (err,local_240,local_238);
    if (local_240 != local_230) {
      operator_delete(local_240);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::ios_base::~ios_base(local_138);
    return -4;
  }
  num_channels = exr_header->num_channels;
  uVar16 = (ulong)num_channels;
  puVar4 = (offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = (offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar6 = exr_header->channels;
  local_220 = head;
  local_218 = size;
  local_210 = offsets;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&channel_offset_list,uVar16);
  if (num_channels == 0) {
    iVar26 = 0;
  }
  else {
    piVar24 = &pEVar6->pixel_type;
    uVar13 = 0;
    iVar26 = 0;
    bVar27 = false;
    uVar23 = 1;
    do {
      channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar23 - 1] = uVar13;
      uVar20 = (ulong)(uint)*piVar24;
      if (2 < uVar20) break;
      iVar26 = iVar26 + *(int *)(&DAT_0029da30 + uVar20 * 4);
      uVar13 = uVar13 + *(long *)(&DAT_0029da40 + uVar20 * 8);
      bVar27 = uVar16 <= uVar23;
      piVar24 = piVar24 + 0x44;
      bVar28 = uVar23 != uVar16;
      uVar23 = uVar23 + 1;
    } while (bVar28);
    if (!bVar27) {
      iVar29 = -4;
      if (err != (string *)0x0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (err,"Failed to compute channel layout.\n");
      }
      goto LAB_00170d94;
    }
  }
  if (exr_header->tiled == 0) {
    if (0xffffffc000000000 < (long)iVar2 * uVar16 * (long)iVar1 - 0x4000000000) {
      iVar22 = num_channels;
      ppuVar11 = AllocateImage(num_channels,exr_header->channels,exr_header->requested_pixel_types,
                               iVar2,iVar1);
      exr_image->images = ppuVar11;
      uVar15 = (uint)((ulong)((long)puVar4 - (long)puVar5) >> 3);
      if (0 < (int)uVar15) {
        uVar23 = 0;
        uVar16 = local_218;
        puVar18 = local_220;
        num_channels = iVar22;
        bVar27 = false;
        do {
          uVar13 = (local_210->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar23];
          bVar28 = true;
          if (uVar13 + 8 <= uVar16) {
            iVar22 = *(int *)(puVar18 + uVar13 + 4);
            if ((ulong)(long)iVar22 <= uVar16 - (uVar13 + 8)) {
              iVar14 = *(int *)(puVar18 + uVar13);
              if (iVar22 != 0 && 0xffbffffe < iVar14 - 0x200001U) {
                iVar21 = (exr_header->data_window).max_y + 1;
                if (iVar29 + iVar14 <= iVar21) {
                  iVar21 = iVar29 + iVar14;
                }
                if (((iVar21 - iVar14 != 0 && iVar14 <= iVar21) &&
                    (iVar19 = (exr_header->data_window).min_y,
                    0xffffffff00000000 < ((long)iVar14 - (long)iVar19) - 0x80000000U)) &&
                   (iVar19 = iVar14 - iVar19, -1 < iVar19)) {
                  bVar28 = DecodePixelData(exr_image->images,exr_header->requested_pixel_types,
                                           puVar18 + uVar13 + 8,(long)iVar22,
                                           exr_header->compression_type,exr_header->line_order,iVar2
                                           ,iVar1,iVar2,(int)uVar23,iVar19,iVar21 - iVar14,
                                           (long)iVar26,(long)exr_header->num_channels,
                                           (EXRAttribute *)exr_header->channels,
                                           (size_t)&channel_offset_list,
                                           (EXRChannelInfo *)
                                           CONCAT44(in_stack_fffffffffffffd8c,num_channels),
                                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           exr_image);
                  bVar28 = (bool)(!bVar28 | bVar27);
                  uVar16 = local_218;
                  puVar18 = local_220;
                }
              }
            }
          }
          uVar23 = uVar23 + 1;
          bVar27 = bVar28;
        } while ((uVar15 & 0x7fffffff) != uVar23);
        if (bVar28) {
          iVar29 = -4;
          if (err == (string *)0x0) goto LAB_00170d94;
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (err,"Invalid data found when decoding pixels.\n");
          goto LAB_00170ccf;
        }
      }
LAB_00170d5d:
      if (0 < exr_header->num_channels) {
        piVar24 = exr_header->pixel_types;
        piVar8 = exr_header->requested_pixel_types;
        lVar17 = 0;
        do {
          piVar24[lVar17] = piVar8[lVar17];
          lVar17 = lVar17 + 1;
        } while (lVar17 < exr_header->num_channels);
      }
      exr_image->num_channels = num_channels;
      exr_image->width = iVar2;
      exr_image->height = iVar1;
      iVar29 = 0;
      goto LAB_00170d94;
    }
    iVar29 = -4;
    if (err == (string *)0x0) goto LAB_00170d94;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Image data size is zero or too large: width = ",0x2e);
    poVar12 = (ostream *)std::ostream::operator<<(local_1a8,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,", height = ",0xb);
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,", channels = ",0xd);
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,num_channels);
    std::endl<char,std::char_traits<char>>(poVar12);
    std::__cxx11::stringbuf::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (err,local_240,local_238);
    if (local_240 != local_230) {
      operator_delete(local_240);
    }
  }
  else if (exr_header->tile_size_x < 0) {
    iVar29 = -9;
    if (err == (string *)0x0) goto LAB_00170d94;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid tile size x : ",0x16);
    poVar12 = (ostream *)std::ostream::operator<<(local_1a8,exr_header->tile_size_x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (err,local_240,local_238);
    if (local_240 != local_230) {
      operator_delete(local_240);
    }
  }
  else {
    if (-1 < exr_header->tile_size_y) {
      puVar4 = (local_210->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      puVar5 = (local_210->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      __size = (long)puVar4 - (long)puVar5 >> 3;
      pEVar10 = (EXRTile *)calloc(0x20,__size);
      exr_image->tiles = pEVar10;
      if (puVar4 != puVar5) {
        lVar17 = __size + (__size == 0);
        lVar25 = 0;
        iVar29 = 0;
        pEVar30 = exr_image;
        do {
          exr_image = pEVar30;
          ppuVar11 = AllocateImage(num_channels,exr_header->channels,
                                   exr_header->requested_pixel_types,exr_header->tile_size_x,
                                   exr_header->tile_size_y);
          pEVar10 = pEVar30->tiles;
          *(uchar ***)((long)&pEVar10->images + lVar25 * 4) = ppuVar11;
          lVar7 = *(long *)((long)(local_210->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data._M_start + lVar25);
          if (local_218 < lVar7 + 0x14U) {
            iVar29 = -4;
            if (err != (string *)0x0) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(err,"Insufficient data size.\n");
            }
            goto LAB_00170d94;
          }
          if (*(int *)(local_220 + lVar7 + 0xc) != 0 || *(int *)(local_220 + lVar7 + 8) != 0) {
            iVar29 = -10;
            goto LAB_00170d94;
          }
          uVar16 = (ulong)*(int *)(local_220 + lVar7 + 0x10);
          if (((long)uVar16 < 4) || (local_218 - (lVar7 + 0x14U) < uVar16)) {
            iVar29 = -4;
            if (err != (string *)0x0) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(err,"Insufficient data length.\n");
            }
            goto LAB_00170d94;
          }
          iVar21 = *(int *)(local_220 + lVar7);
          uVar15 = *(uint *)(local_220 + lVar7 + 4);
          iVar19 = exr_header->tile_size_x;
          if (((iVar2 < iVar19) || (height = exr_header->tile_size_y, iVar1 < height)) ||
             ((iVar2 < iVar19 * iVar21 || (iVar1 < (int)(height * uVar15))))) {
            if (err != (string *)0x0) goto LAB_001707d1;
            iVar29 = -4;
          }
          else {
            piVar24 = exr_header->requested_pixel_types;
            local_204 = exr_header->compression_type;
            line_order = exr_header->line_order;
            iVar3 = exr_header->num_channels;
            width = iVar2 - iVar19 * iVar21;
            if ((iVar21 + 1) * iVar19 <= iVar22) {
              width = iVar19;
            }
            attributes = (EXRAttribute *)exr_header->channels;
            (&pEVar10->width)[lVar25] = width;
            num_lines = iVar1 - height * uVar15;
            if ((int)((uVar15 + 1) * height) <= iVar14) {
              num_lines = height;
            }
            (&pEVar10->height)[lVar25] = num_lines;
            local_200 = (ulong)uVar15;
            bVar27 = DecodePixelData(ppuVar11,piVar24,local_220 + lVar7 + 0x14,uVar16,local_204,
                                     line_order,width,height,iVar19,0,0,num_lines,(long)iVar26,
                                     (long)iVar3,attributes,(size_t)&channel_offset_list,
                                     (EXRChannelInfo *)CONCAT44(iVar29,num_channels),
                                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     exr_image);
            uVar15 = (uint)local_200;
            if (!bVar27) {
              iVar29 = -4;
            }
            if (err != (string *)0x0 && !bVar27) {
LAB_001707d1:
              iVar29 = -4;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(err,"Failed to decode tile data.\n");
            }
          }
          pEVar10 = exr_image->tiles;
          (&pEVar10->offset_x)[lVar25] = iVar21;
          (&pEVar10->offset_y)[lVar25] = uVar15;
          *(undefined8 *)(&pEVar10->level_x + lVar25) = 0;
          lVar25 = lVar25 + 8;
          lVar17 = lVar17 + -1;
          pEVar30 = exr_image;
        } while (lVar17 != 0);
        if (iVar29 != 0) goto LAB_00170d94;
      }
      exr_image->num_tiles = (int)__size;
      goto LAB_00170d5d;
    }
    iVar29 = -9;
    if (err == (string *)0x0) goto LAB_00170d94;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid tile size y : ",0x16);
    poVar12 = (ostream *)std::ostream::operator<<(local_1a8,exr_header->tile_size_y);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (err,local_240,local_238);
    if (local_240 != local_230) {
      operator_delete(local_240);
    }
  }
LAB_00170ccf:
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_138);
LAB_00170d94:
  if (channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(channel_offset_list.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar29;
}

Assistant:

static int DecodeChunk(EXRImage *exr_image, const EXRHeader *exr_header,
                       const std::vector<tinyexr::tinyexr_uint64> &offsets,
                       const unsigned char *head, const size_t size,
                       std::string *err) {
  int num_channels = exr_header->num_channels;

  int num_scanline_blocks = 1;
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    num_scanline_blocks = 16;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    num_scanline_blocks = 32;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    num_scanline_blocks = 16;

#if TINYEXR_USE_ZFP
    tinyexr::ZFPCompressionParam zfp_compression_param;
    if (!FindZFPCompressionParam(&zfp_compression_param,
                                 exr_header->custom_attributes,
                                 int(exr_header->num_custom_attributes), err)) {
      return TINYEXR_ERROR_INVALID_HEADER;
    }
#endif
  }

  if (exr_header->data_window.max_x < exr_header->data_window.min_x ||
      exr_header->data_window.max_y < exr_header->data_window.min_y) {
    if (err) {
      (*err) += "Invalid data window.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  int data_width =
      exr_header->data_window.max_x - exr_header->data_window.min_x + 1;
  int data_height =
      exr_header->data_window.max_y - exr_header->data_window.min_y + 1;

  // Do not allow too large data_width and data_height. header invalid?
  {
    const int threshold = 1024 * 8192;  // heuristics
    if ((data_width > threshold) || (data_height > threshold)) {
      if (err) {
        std::stringstream ss;
        ss << "data_with or data_height too large. data_width: " << data_width
           << ", "
           << "data_height = " << data_height << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }
  }

  size_t num_blocks = offsets.size();

  std::vector<size_t> channel_offset_list;
  int pixel_data_size = 0;
  size_t channel_offset = 0;
  if (!tinyexr::ComputeChannelLayout(&channel_offset_list, &pixel_data_size,
                                     &channel_offset, num_channels,
                                     exr_header->channels)) {
    if (err) {
      (*err) += "Failed to compute channel layout.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  bool invalid_data = false;  // TODO(LTE): Use atomic lock for MT safety.

  if (exr_header->tiled) {
    // value check
    if (exr_header->tile_size_x < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size x : " << exr_header->tile_size_x << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    if (exr_header->tile_size_y < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size y : " << exr_header->tile_size_y << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    size_t num_tiles = offsets.size();  // = # of blocks

    exr_image->tiles = static_cast<EXRTile *>(
        calloc(sizeof(EXRTile), static_cast<size_t>(num_tiles)));

    int err_code = TINYEXR_SUCCESS;

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)

    std::vector<std::thread> workers;
    std::atomic<size_t> tile_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_tiles)) {
      num_threads = int(num_tiles);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        size_t tile_idx = 0;
        while ((tile_idx = tile_count++) < num_tiles) {

#else
    for (size_t tile_idx = 0; tile_idx < num_tiles; tile_idx++) {
#endif
          // Allocate memory for each tile.
          exr_image->tiles[tile_idx].images = tinyexr::AllocateImage(
              num_channels, exr_header->channels,
              exr_header->requested_pixel_types, exr_header->tile_size_x,
              exr_header->tile_size_y);

          // 16 byte: tile coordinates
          // 4 byte : data size
          // ~      : data(uncompressed or compressed)
          if (offsets[tile_idx] + sizeof(int) * 5 > size) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Insufficient data size.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
            break;
          }

          size_t data_size =
              size_t(size - (offsets[tile_idx] + sizeof(int) * 5));
          const unsigned char *data_ptr =
              reinterpret_cast<const unsigned char *>(head + offsets[tile_idx]);

          int tile_coordinates[4];
          memcpy(tile_coordinates, data_ptr, sizeof(int) * 4);
          tinyexr::swap4(&tile_coordinates[0]);
          tinyexr::swap4(&tile_coordinates[1]);
          tinyexr::swap4(&tile_coordinates[2]);
          tinyexr::swap4(&tile_coordinates[3]);

          // @todo{ LoD }
          if (tile_coordinates[2] != 0) {
            err_code = TINYEXR_ERROR_UNSUPPORTED_FEATURE;
            break;
          }
          if (tile_coordinates[3] != 0) {
            err_code = TINYEXR_ERROR_UNSUPPORTED_FEATURE;
            break;
          }

          int data_len;
          memcpy(&data_len, data_ptr + 16,
                 sizeof(int));  // 16 = sizeof(tile_coordinates)
          tinyexr::swap4(&data_len);

          if (data_len < 4 || size_t(data_len) > data_size) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Insufficient data length.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
            break;
          }

          // Move to data addr: 20 = 16 + 4;
          data_ptr += 20;

          bool ret = tinyexr::DecodeTiledPixelData(
              exr_image->tiles[tile_idx].images,
              &(exr_image->tiles[tile_idx].width),
              &(exr_image->tiles[tile_idx].height),
              exr_header->requested_pixel_types, data_ptr,
              static_cast<size_t>(data_len), exr_header->compression_type,
              exr_header->line_order, data_width, data_height,
              tile_coordinates[0], tile_coordinates[1], exr_header->tile_size_x,
              exr_header->tile_size_y, static_cast<size_t>(pixel_data_size),
              static_cast<size_t>(exr_header->num_custom_attributes),
              exr_header->custom_attributes,
              static_cast<size_t>(exr_header->num_channels),
              exr_header->channels, channel_offset_list);

          if (!ret) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Failed to decode tile data.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
          }

          exr_image->tiles[tile_idx].offset_x = tile_coordinates[0];
          exr_image->tiles[tile_idx].offset_y = tile_coordinates[1];
          exr_image->tiles[tile_idx].level_x = tile_coordinates[2];
          exr_image->tiles[tile_idx].level_y = tile_coordinates[3];

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }  // num_thread loop

    for (auto &t : workers) {
      t.join();
    }

#else
    }
#endif

    if (err_code != TINYEXR_SUCCESS) {
      return err_code;
    }

    exr_image->num_tiles = static_cast<int>(num_tiles);
  } else {  // scanline format

    // Don't allow too large image(256GB * pixel_data_size or more). Workaround
    // for #104.
    size_t total_data_len =
        size_t(data_width) * size_t(data_height) * size_t(num_channels);
    const bool total_data_len_overflown =
        sizeof(void *) == 8 ? (total_data_len >= 0x4000000000) : false;
    if ((total_data_len == 0) || total_data_len_overflown) {
      if (err) {
        std::stringstream ss;
        ss << "Image data size is zero or too large: width = " << data_width
           << ", height = " << data_height << ", channels = " << num_channels
           << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    exr_image->images = tinyexr::AllocateImage(
        num_channels, exr_header->channels, exr_header->requested_pixel_types,
        data_width, data_height);

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
    std::vector<std::thread> workers;
    std::atomic<int> y_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_blocks)) {
      num_threads = int(num_blocks);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        int y = 0;
        while ((y = y_count++) < int(num_blocks)) {

#else

#if TINYEXR_USE_OPENMP
#pragma omp parallel for
#endif
    for (int y = 0; y < static_cast<int>(num_blocks); y++) {

#endif
          size_t y_idx = static_cast<size_t>(y);

          if (offsets[y_idx] + sizeof(int) * 2 > size) {
            invalid_data = true;
          } else {
            // 4 byte: scan line
            // 4 byte: data size
            // ~     : pixel data(uncompressed or compressed)
            size_t data_size =
                size_t(size - (offsets[y_idx] + sizeof(int) * 2));
            const unsigned char *data_ptr =
                reinterpret_cast<const unsigned char *>(head + offsets[y_idx]);

            int line_no;
            memcpy(&line_no, data_ptr, sizeof(int));
            int data_len;
            memcpy(&data_len, data_ptr + 4, sizeof(int));
            tinyexr::swap4(&line_no);
            tinyexr::swap4(&data_len);

            if (size_t(data_len) > data_size) {
              invalid_data = true;

            } else if ((line_no > (2 << 20)) || (line_no < -(2 << 20))) {
              // Too large value. Assume this is invalid
              // 2**20 = 1048576 = heuristic value.
              invalid_data = true;
            } else if (data_len == 0) {
              // TODO(syoyo): May be ok to raise the threshold for example
              // `data_len < 4`
              invalid_data = true;
            } else {
              // line_no may be negative.
              int end_line_no = (std::min)(line_no + num_scanline_blocks,
                                           (exr_header->data_window.max_y + 1));

              int num_lines = end_line_no - line_no;

              if (num_lines <= 0) {
                invalid_data = true;
              } else {
                // Move to data addr: 8 = 4 + 4;
                data_ptr += 8;

                // Adjust line_no with data_window.bmin.y

                // overflow check
                tinyexr_int64 lno =
                    static_cast<tinyexr_int64>(line_no) -
                    static_cast<tinyexr_int64>(exr_header->data_window.min_y);
                if (lno > std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else if (lno < -std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else {
                  line_no -= exr_header->data_window.min_y;
                }

                if (line_no < 0) {
                  invalid_data = true;
                } else {
                  if (!tinyexr::DecodePixelData(
                          exr_image->images, exr_header->requested_pixel_types,
                          data_ptr, static_cast<size_t>(data_len),
                          exr_header->compression_type, exr_header->line_order,
                          data_width, data_height, data_width, y, line_no,
                          num_lines, static_cast<size_t>(pixel_data_size),
                          static_cast<size_t>(
                              exr_header->num_custom_attributes),
                          exr_header->custom_attributes,
                          static_cast<size_t>(exr_header->num_channels),
                          exr_header->channels, channel_offset_list)) {
                    invalid_data = true;
                  }
                }
              }
            }
          }

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }

    for (auto &t : workers) {
      t.join();
    }
#else
    }  // omp parallel
#endif
  }

  if (invalid_data) {
    if (err) {
      std::stringstream ss;
      (*err) += "Invalid data found when decoding pixels.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Overwrite `pixel_type` with `requested_pixel_type`.
  {
    for (int c = 0; c < exr_header->num_channels; c++) {
      exr_header->pixel_types[c] = exr_header->requested_pixel_types[c];
    }
  }

  {
    exr_image->num_channels = num_channels;

    exr_image->width = data_width;
    exr_image->height = data_height;
  }

  return TINYEXR_SUCCESS;
}